

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall
BpTree<float>::Redistribute
          (BpTree<float> *this,IndexNode<float> *C,IndexNode<float> *D,float k2,int i,int j)

{
  uint uVar1;
  pointer pfVar2;
  pointer pcVar3;
  pointer pAVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  IndexNode<float> P;
  IndexNode<float> E;
  IndexNode<float> local_390;
  IndexNode<float> local_330;
  IndexNode<float> local_2d0;
  IndexNode<float> local_270;
  IndexNode<float> local_210;
  IndexNode<float> local_1b0;
  IndexNode<float> local_150;
  IndexNode<float> local_f0;
  IndexNode<float> local_90;
  
  IndexNode<float>::IndexNode(&local_150,C);
  Buffer::Lock(&blocks,local_150.self.BlockNum);
  IndexNode<float>::~IndexNode(&local_150);
  IndexNode<float>::IndexNode(&local_1b0,D);
  Buffer::Lock(&blocks,local_1b0.self.BlockNum);
  IndexNode<float>::~IndexNode(&local_1b0);
  IndexNode<float>::IndexNode(&P,this->N);
  IndexNode<float>::IndexNode(&E,this->N);
  FindNode(this,C->parent,&P);
  if (j < i) {
    IndexNode<float>::IndexNode(&local_90,C);
    IndexNode<float>::~IndexNode(&local_90);
    uVar1 = this->N;
    if (local_90.NodeState == '1') {
      uVar6 = 1;
      if (1 < (int)uVar1) {
        uVar6 = uVar1;
      }
      uVar6 = uVar6 - 1;
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        if ((D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar10] != '1') {
          uVar6 = (uint)uVar10;
          break;
        }
      }
      for (uVar10 = (ulong)(uVar1 - 2); 0 < (int)uVar10; uVar10 = uVar10 - 1) {
        pfVar2 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2[uVar10] = pfVar2[uVar10 - 1];
        pcVar3 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3[uVar10] = pcVar3[uVar10 - 1];
        pAVar4 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar4[uVar10] = pAVar4[uVar10 - 1];
      }
      lVar5 = (long)(int)uVar6;
      *(C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = (D->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5 + -1];
      *(C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start = '1';
      *(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
       _M_start = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5 + -1];
      P.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
      [j] = (D->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar5 + -1];
      (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5 + -1] = '0';
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + lVar5 + -1;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
    }
    else {
      uVar9 = 0;
      uVar10 = 0;
      if (0 < (int)uVar1) {
        uVar10 = (ulong)uVar1;
      }
      for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        if ((D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar9].FileOff == -1) {
          uVar10 = uVar9 & 0xffffffff;
          break;
        }
      }
      pAVar4 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar4[(long)(int)uVar1 + -1] = pAVar4[(long)(int)uVar1 + -2];
      for (uVar9 = (ulong)(this->N - 2);
          pfVar2 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start, 0 < (int)uVar9; uVar9 = uVar9 - 1) {
        pfVar2[uVar9] = pfVar2[uVar9 - 1];
        pcVar3 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3[uVar9] = pcVar3[uVar9 - 1];
        pAVar4 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar4[uVar9] = pAVar4[uVar9 - 1];
      }
      lVar5 = (long)(int)uVar10;
      *pfVar2 = k2;
      *(C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start = '1';
      *(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
       _M_start = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5 + -1];
      FindNode(this,(D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5 + -1],&E);
      E.parent = C->self;
      IndexNode<float>::IndexNode(&local_210,&E);
      UpdateBlock(this,&local_210);
      IndexNode<float>::~IndexNode(&local_210);
      P.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
      [j] = (D->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar5 + -2];
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + lVar5 + -1;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
      (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5 + -2] = '0';
    }
  }
  else {
    IndexNode<float>::IndexNode(&local_f0,C);
    IndexNode<float>::~IndexNode(&local_f0);
    uVar1 = this->N;
    if (local_f0.NodeState == '1') {
      pcVar3 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 1;
      if (1 < (int)uVar1) {
        uVar6 = uVar1;
      }
      for (uVar10 = 0;
          (uVar9 = (ulong)(uVar6 - 1), uVar6 - 1 != uVar10 &&
          (uVar9 = uVar10, pcVar3[uVar10] == '1')); uVar10 = uVar10 + 1) {
      }
      (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] =
           *(D->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start;
      pcVar3[uVar9] = '1';
      (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] =
           *(D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start;
      P.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
      [i] = (D->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start[1];
      for (lVar5 = 1; lVar5 < (long)this->N + -1; lVar5 = lVar5 + 1) {
        pfVar2 = (D->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2[lVar5 + -1] = pfVar2[lVar5];
        pcVar3 = (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3[lVar5 + -1] = pcVar3[lVar5];
        pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar4[lVar5 + -1] = pAVar4[lVar5];
      }
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + (long)this->N + -2;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
    }
    else {
      uVar9 = 0;
      uVar10 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar10 = uVar9;
      }
      for (; uVar7 = uVar10, uVar10 != uVar9; uVar9 = uVar9 + 1) {
        if ((C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar9].FileOff == -1) {
          uVar10 = uVar9 & 0xffffffff;
          uVar7 = uVar9;
          break;
        }
      }
      (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)(int)uVar10 + -1] = k2;
      (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)(int)uVar10 + -1] = '1';
      (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar7] =
           *(D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start;
      FindNode(this,*(D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                     super__Vector_impl_data._M_start,&E);
      E.parent = C->self;
      IndexNode<float>::IndexNode(&local_270,&E);
      UpdateBlock(this,&local_270);
      IndexNode<float>::~IndexNode(&local_270);
      P.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
      [i] = *(D->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
      for (lVar5 = 1; lVar8 = (long)this->N, lVar5 < lVar8 + -1; lVar5 = lVar5 + 1) {
        pfVar2 = (D->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2[lVar5 + -1] = pfVar2[lVar5];
        pcVar3 = (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3[lVar5 + -1] = pcVar3[lVar5];
        pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar4[lVar5 + -1] = pAVar4[lVar5];
      }
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar4[lVar8 + -2] = pAVar4[lVar8 + -1];
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + (long)this->N + -1;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
    }
    (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
    [(long)this->N + -2] = '0';
  }
  IndexNode<float>::IndexNode(&local_2d0,C);
  UpdateBlock(this,&local_2d0);
  IndexNode<float>::~IndexNode(&local_2d0);
  IndexNode<float>::IndexNode(&local_330,D);
  UpdateBlock(this,&local_330);
  IndexNode<float>::~IndexNode(&local_330);
  IndexNode<float>::IndexNode(&local_390,&P);
  UpdateBlock(this,&local_390);
  IndexNode<float>::~IndexNode(&local_390);
  IndexNode<float>::~IndexNode(&E);
  IndexNode<float>::~IndexNode(&P);
  return;
}

Assistant:

void BpTree<K>::Redistribute(IndexNode<K>& C, IndexNode<K>& D, K k2, int i, int j) {
	this->LockNode(C);
	this->LockNode(D);
	IndexNode<K> P(N);
	IndexNode<K> E(N);
	this->FindNode(C.parent, P);
	int m, n;
	//�������������
	if (j < i) {
		//D��C������
		if (!this->IsLeaf(C)) {
			for (m = 0; m < N && D.p[m].FileOff != -1; m++);
			m--;		//D.p[m]��D�����һ����Чָ��
			C.p[N - 1] = C.p[N - 2];
			for (n = N - 2; n >= 1; n--) {
				C.k[n] = C.k[n - 1];
				C.v[n] = C.v[n - 1];
				C.p[n] = C.p[n - 1];
			}
			C.k[0] = k2;
			C.v[0] = '1';
			C.p[0] = D.p[m];							//�ֳ�����һ�����C��
			this->FindNode(D.p[m], E);
			E.parent = C.self;		//���±��ƶ����ĸ���
			this->UpdateBlock(E);
			P.k[j] = D.k[m - 1];						//����CD֮��ļ�ֵ
			D.p[m] = { -1,-1 };
			D.v[m - 1] = '0';							//ɾ��D�б��ֳ�ȥ����һ��
		}
		else {
			for (m = 0; m < N - 1 && D.v[m] == '1'; m++);
			m--;		//(D.p[m],D.k[m])��D�����һ����Ч����
			for (n = N - 2; n >= 1; n--) {
				C.k[n] = C.k[n - 1];
				C.v[n] = C.v[n - 1];
				C.p[n] = C.p[n - 1];
			}
			C.k[0] = D.k[m];
			C.v[0] = '1';
			C.p[0] = D.p[m];							//�ֳ�����һ�����C��
			P.k[j] = D.k[m];		//����CD֮��ļ�ֵ
			D.v[m] = '0';
			D.p[m] = { -1, -1 };						//ɾ��D�б��ֳ�ȥ����һ��
		}
	}
	else {
		//D��C������
		if (!this->IsLeaf(C)) {
			for (m = 0; m < N && C.p[m].FileOff != -1; m++);		//C.p[m]��C.k[m-1]�ǿյ�
			C.k[m - 1] = k2;
			C.v[m - 1] = '1';
			C.p[m] = D.p[0];
			this->FindNode(D.p[0], E);
			E.parent = C.self;
			this->UpdateBlock(E);
			P.k[i] = D.k[0];
			for (n = 1; n < N - 1; n++) {
				D.k[n - 1] = D.k[n];
				D.v[n - 1] = D.v[n];
				D.p[n - 1] = D.p[n];
			}
			D.p[N - 2] = D.p[N - 1];
			D.p[N - 1] = { -1, -1 };
			D.v[N - 2] = '0';
		}
		else {
			for (m = 0; m < N - 1 && C.v[m] == '1'; m++);		//C.k[m]��C.p[m]�ǿյ�
			C.k[m] = D.k[0];
			C.v[m] = '1';
			C.p[m] = D.p[0];
			P.k[i] = D.k[1];
			for (n = 1; n < N - 1; n++) {
				D.k[n - 1] = D.k[n];
				D.v[n - 1] = D.v[n];
				D.p[n - 1] = D.p[n];
			}
			D.p[N - 2] = { -1, -1 };
			D.v[N - 2] = '0';
		}
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	this->UpdateBlock(P);
	return;
}